

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_CallSpecial
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *activator;
  int iVar1;
  VMValue *pVVar2;
  bool bVar3;
  bool local_63;
  int u;
  int iStack_54;
  bool res;
  int arg5;
  int arg4;
  int arg3;
  int arg2;
  int arg1;
  int special;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x595,
                  "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x595,
                  "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  activator = (AActor *)(param->field_0).field_1.a;
  local_63 = true;
  if (activator != (AActor *)0x0) {
    local_63 = DObject::IsKindOf((DObject *)activator,AActor::RegistrationInfo.MyClass);
  }
  if (local_63 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x595,
                  "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x596,
                  "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x596,
                  "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  iVar1 = param[1].field_0.i;
  if (numparam < 3) {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x597,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    arg3 = (pVVar2->field_0).i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x597,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    arg3 = param[2].field_0.i;
  }
  if (numparam < 4) {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x598,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    arg4 = (pVVar2->field_0).i;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x598,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    arg4 = param[3].field_0.i;
  }
  if (numparam < 5) {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x599,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    arg5 = (pVVar2->field_0).i;
  }
  else {
    if (param[4].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x599,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    arg5 = param[4].field_0.i;
  }
  if (numparam < 6) {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x59a,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    iStack_54 = (pVVar2->field_0).i;
  }
  else {
    if (param[5].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x59a,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iStack_54 = param[5].field_0.i;
  }
  if (numparam < 7) {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x59b,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
    u = (pVVar2->field_0).i;
  }
  else {
    if (param[6].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x59b,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    u = param[6].field_0.i;
  }
  iVar1 = P_ExecuteSpecial(iVar1,(line_t *)0x0,activator,false,arg3,arg4,arg5,iStack_54,u);
  if (numret < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x59f,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    VMReturn::SetInt(ret,(uint)(iVar1 != 0));
    param_local._4_4_ = 1;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CallSpecial)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(special);
	PARAM_INT_DEF	(arg1);
	PARAM_INT_DEF	(arg2);
	PARAM_INT_DEF	(arg3);
	PARAM_INT_DEF	(arg4);
	PARAM_INT_DEF	(arg5);

	bool res = !!P_ExecuteSpecial(special, NULL, self, false, arg1, arg2, arg3, arg4, arg5);

	ACTION_RETURN_BOOL(res);
}